

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

LogLevel pbrt::LogLevelFromString(string *s)

{
  int iVar1;
  LogLevel LVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)s);
  if (iVar1 == 0) {
    LVar2 = Verbose;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)s);
    if (iVar1 == 0) {
      LVar2 = Error;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)s);
      LVar2 = Invalid - (iVar1 == 0);
    }
  }
  return LVar2;
}

Assistant:

LogLevel LogLevelFromString(const std::string &s) {
    if (s == "verbose")
        return LogLevel::Verbose;
    else if (s == "error")
        return LogLevel::Error;
    else if (s == "fatal")
        return LogLevel::Fatal;
    return LogLevel::Invalid;
}